

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool is_globalmv_better(PREDICTION_MODE this_mode,MV_REFERENCE_FRAME ref_frame,int rate_mv,
                        ModeCosts *mode_costs,int (*single_inter_mode_costs) [8],
                        MB_MODE_INFO_EXT *mbmi_ext)

{
  int iVar1;
  int (*drl_mode_cost0) [2];
  long in_RCX;
  int in_EDX;
  char in_SIL;
  byte in_DIL;
  long in_R8;
  undefined8 in_R9;
  MV_REFERENCE_FRAME rf [2];
  int this_mode_cost;
  int globalmv_mode_cost;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  undefined4 local_28;
  int ref_mv_idx;
  undefined8 uVar3;
  
  ref_mv_idx = *(int *)(in_R8 + 0x40 + (long)in_SIL * 4);
  local_28 = in_EDX + *(int *)(in_R8 + (long)(int)(in_DIL - 0xd) * 0x20 + (long)in_SIL * 4);
  if ((in_DIL == 0x10) || (in_DIL == 0xe)) {
    uVar2 = 0xff;
    drl_mode_cost0 = (int (*) [2])(in_RCX + 0x3d28);
    uVar3 = in_R9;
    av1_ref_frame_type(in_stack_ffffffffffffffb8);
    iVar1 = get_drl_cost((PREDICTION_MODE)((ulong)uVar3 >> 0x18),ref_mv_idx,
                         (MB_MODE_INFO_EXT *)
                         CONCAT17(uVar2,CONCAT16(in_SIL,in_stack_ffffffffffffffd0)),drl_mode_cost0,
                         (int8_t)((ulong)in_R9 >> 0x38));
    local_28 = iVar1 + local_28;
  }
  return ref_mv_idx < local_28;
}

Assistant:

static inline bool is_globalmv_better(
    PREDICTION_MODE this_mode, MV_REFERENCE_FRAME ref_frame, int rate_mv,
    const ModeCosts *mode_costs,
    const int (*single_inter_mode_costs)[REF_FRAMES],
    const MB_MODE_INFO_EXT *mbmi_ext) {
  const int globalmv_mode_cost =
      single_inter_mode_costs[INTER_OFFSET(GLOBALMV)][ref_frame];
  int this_mode_cost =
      rate_mv + single_inter_mode_costs[INTER_OFFSET(this_mode)][ref_frame];
  if (this_mode == NEWMV || this_mode == NEARMV) {
    const MV_REFERENCE_FRAME rf[2] = { ref_frame, NONE_FRAME };
    this_mode_cost += get_drl_cost(
        NEWMV, 0, mbmi_ext, mode_costs->drl_mode_cost0, av1_ref_frame_type(rf));
  }
  return this_mode_cost > globalmv_mode_cost;
}